

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  Fts5Config *pFVar1;
  int iVar2;
  char *z_00;
  Fts5Config *pConfig;
  char *z;
  Fts5Colset *pFStack_28;
  int iCol;
  Fts5Colset *pRet;
  Fts5Token *p_local;
  Fts5Colset *pColset_local;
  Fts5Parse *pParse_local;
  
  pFStack_28 = (Fts5Colset *)0x0;
  z_00 = sqlite3Fts5Strndup(&pParse->rc,p->p,p->n);
  if (pParse->rc == 0) {
    pFVar1 = pParse->pConfig;
    sqlite3Fts5Dequote(z_00);
    z._4_4_ = 0;
    while ((z._4_4_ < pFVar1->nCol &&
           (iVar2 = sqlite3_stricmp(pFVar1->azCol[z._4_4_],z_00), iVar2 != 0))) {
      z._4_4_ = z._4_4_ + 1;
    }
    if (z._4_4_ == pFVar1->nCol) {
      sqlite3Fts5ParseError(pParse,"no such column: %s",z_00);
    }
    else {
      pFStack_28 = fts5ParseColset(pParse,pColset,z._4_4_);
    }
    sqlite3_free(z_00);
  }
  if (pFStack_28 == (Fts5Colset *)0x0) {
    sqlite3_free(pColset);
  }
  return pFStack_28;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}